

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_compute.cpp
# Opt level: O0

void create_descriptor(Init *init,Data *data)

{
  undefined1 local_a8 [8];
  VkDescriptorSetAllocateInfo ds_allocate_info;
  VkDescriptorSetLayoutCreateInfo dsl_info;
  VkDescriptorSetLayoutBinding binding;
  VkDescriptorPoolCreateInfo pool_info;
  VkDescriptorPoolSize pool_size;
  Data *data_local;
  Init *init_local;
  
  pool_info.pPoolSizes = (VkDescriptorPoolSize *)0x200000007;
  memset(&binding.pImmutableSamplers,0,0x28);
  binding.pImmutableSamplers._0_4_ = 0x21;
  pool_info.pNext._0_4_ = 0;
  pool_info.pNext._4_4_ = 1;
  pool_info.flags = 1;
  pool_info._24_8_ = &pool_info.pPoolSizes;
  vkb::DispatchTable::createDescriptorPool
            (&init->disp,(VkDescriptorPoolCreateInfo *)&binding.pImmutableSamplers,
             (VkAllocationCallbacks *)0x0,&data->descriptor_pool);
  dsl_info.pBindings = (VkDescriptorSetLayoutBinding *)0x700000000;
  binding.binding = 2;
  binding.descriptorType = VK_DESCRIPTOR_TYPE_MAX_ENUM;
  binding.descriptorCount = 0;
  binding.stageFlags = 0;
  memset(&ds_allocate_info.pSetLayouts,0,0x20);
  ds_allocate_info.pSetLayouts._0_4_ = 0x20;
  dsl_info.pNext._0_4_ = 0;
  dsl_info.pNext._4_4_ = 1;
  dsl_info._16_8_ = &dsl_info.pBindings;
  vkb::DispatchTable::createDescriptorSetLayout
            (&init->disp,(VkDescriptorSetLayoutCreateInfo *)&ds_allocate_info.pSetLayouts,
             (VkAllocationCallbacks *)0x0,&data->descriptor_set_layout);
  memset(local_a8,0,0x28);
  local_a8._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  ds_allocate_info.pNext = data->descriptor_pool;
  ds_allocate_info.descriptorPool._0_4_ = 1;
  ds_allocate_info._24_8_ = &data->descriptor_set_layout;
  vkb::DispatchTable::allocateDescriptorSets
            (&init->disp,(VkDescriptorSetAllocateInfo *)local_a8,&data->descriptor_set);
  return;
}

Assistant:

void create_descriptor(Init& init, Data& data) {
    VkDescriptorPoolSize pool_size = { VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, 2 };

    VkDescriptorPoolCreateInfo pool_info = {};
    pool_info.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
    pool_info.flags = 0;
    pool_info.maxSets = 1;
    pool_info.poolSizeCount = 1;
    pool_info.pPoolSizes = &pool_size;
    init.disp.createDescriptorPool(&pool_info, nullptr, &data.descriptor_pool);

    VkDescriptorSetLayoutBinding binding = { 0, VK_DESCRIPTOR_TYPE_STORAGE_BUFFER, 2, VK_SHADER_STAGE_ALL, nullptr };
    VkDescriptorSetLayoutCreateInfo dsl_info = {};
    dsl_info.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
    dsl_info.flags = 0;
    dsl_info.bindingCount = 1;
    dsl_info.pBindings = &binding;
    init.disp.createDescriptorSetLayout(&dsl_info, nullptr, &data.descriptor_set_layout);

    VkDescriptorSetAllocateInfo ds_allocate_info = {};
    ds_allocate_info.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
    ds_allocate_info.descriptorPool = data.descriptor_pool;
    ds_allocate_info.descriptorSetCount = 1;
    ds_allocate_info.pSetLayouts = &data.descriptor_set_layout;
    init.disp.allocateDescriptorSets(&ds_allocate_info, &data.descriptor_set);
}